

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtperrors.cpp
# Opt level: O1

string * __thiscall
jrtplib::RTPGetErrorString_abi_cxx11_(string *__return_storage_ptr__,jrtplib *this,int errcode)

{
  int *piVar1;
  size_type *psVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  size_t sVar5;
  undefined8 *puVar6;
  int iVar7;
  ulong uVar8;
  char str [16];
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  char local_38 [24];
  
  iVar7 = (int)this;
  if (iVar7 < 0) {
    puVar4 = ErrorDescriptions;
    if (iVar7 != -1) {
      do {
        piVar1 = (int *)(puVar4 + 0x10);
        if (*piVar1 == 0) {
          snprintf(local_38,0x10,"(%d)");
          local_58 = local_48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"Unknown error code","");
          local_78 = local_68;
          sVar5 = strlen(local_38);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,local_38,local_38 + sVar5);
          uVar8 = 0xf;
          if (local_58 != local_48) {
            uVar8 = local_48[0];
          }
          if (uVar8 < (ulong)(local_70 + local_50)) {
            uVar8 = 0xf;
            if (local_78 != local_68) {
              uVar8 = local_68[0];
            }
            if ((ulong)(local_70 + local_50) <= uVar8) {
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_58)
              ;
              goto LAB_0011b174;
            }
          }
          puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78);
LAB_0011b174:
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          psVar2 = puVar6 + 2;
          if ((size_type *)*puVar6 == psVar2) {
            uVar3 = puVar6[3];
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
          }
          __return_storage_ptr__->_M_string_length = puVar6[1];
          *puVar6 = psVar2;
          puVar6[1] = 0;
          *(undefined1 *)psVar2 = 0;
          if (local_78 != local_68) {
            operator_delete(local_78,local_68[0] + 1);
          }
          if (local_58 == local_48) {
            return __return_storage_ptr__;
          }
          operator_delete(local_58,local_48[0] + 1);
          return __return_storage_ptr__;
        }
        puVar4 = puVar4 + 0x10;
      } while (*piVar1 != iVar7);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,*(char **)(puVar4 + 8),(allocator<char> *)&local_58)
    ;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"No error","");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RTPGetErrorString(int errcode)
{
	int i;
	
	if (errcode >= 0)
		return std::string("No error");
	
	i = 0;
	while (ErrorDescriptions[i].code != 0)
	{
		if (ErrorDescriptions[i].code == errcode)
			return std::string(ErrorDescriptions[i].description);
		i++;
	}

	char str[16];
	
	RTP_SNPRINTF(str,16,"(%d)",errcode);
	
	return std::string("Unknown error code") + std::string(str);
}